

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *
pbrt::ShapeHandle::Create
          (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
           *__return_storage_ptr__,string *name,Transform *renderFromObject,
          Transform *objectFromRender,bool reverseOrientation,ParameterDictionary *parameters,
          FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *ppiVar2;
  span<const_pbrt::Point3<float>_> p;
  int iVar3;
  TriangleMesh *pTVar4;
  Sphere *pSVar5;
  Cylinder *pCVar6;
  Disk *pDVar7;
  BilinearPatchMesh *mesh;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar8;
  char *fmt;
  _Alloc_hider _Var9;
  undefined7 in_register_00000081;
  FileLoc *loc_00;
  long in_FS_OFFSET;
  span<const_int> vertexIndices_00;
  bool reverseOrientation_local;
  Allocator alloc_local;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> quadMesh;
  string scheme;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> local_100;
  vector<int,_std::allocator<int>_> local_e8;
  vector<int,_std::allocator<int>_> local_d0;
  vector<int,_std::allocator<int>_> local_b8;
  string filename;
  vector<int,_std::allocator<int>_> vertexIndices;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> P;
  
  loc_00 = (FileLoc *)CONCAT71(in_register_00000081,reverseOrientation);
  alloc_local = alloc;
  (__return_storage_ptr__->alloc).memoryResource = alloc.memoryResource;
  __return_storage_ptr__->ptr = (ShapeHandle *)0x0;
  __return_storage_ptr__->nAlloc = 0;
  __return_storage_ptr__->nStored = 0;
  reverseOrientation_local = reverseOrientation;
  iVar3 = std::__cxx11::string::compare((char *)name);
  if (iVar3 == 0) {
    pSVar5 = Sphere::Create(renderFromObject,objectFromRender,reverseOrientation_local,parameters,
                            loc_00,alloc_local);
    scheme._M_dataplus._M_p = (pointer)pstd::pmr::new_delete_resource();
    scheme._M_string_length = 0;
    scheme.field_2._M_allocated_capacity = 0;
    scheme.field_2._8_8_ = 0;
    pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::reserve
              ((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *)
               &scheme,1);
    *(ulong *)scheme._M_string_length = (ulong)pSVar5 | 0x1000000000000;
    scheme.field_2._8_8_ = scheme.field_2._M_allocated_capacity;
    pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::operator=
              (__return_storage_ptr__,
               (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *)
               &scheme);
    scheme.field_2._8_8_ = 0;
    (**(code **)(*(long *)scheme._M_dataplus._M_p + 0x18))
              (scheme._M_dataplus._M_p,scheme._M_string_length,
               scheme.field_2._M_allocated_capacity << 3,8);
    *(long *)(in_FS_OFFSET + -0x440) = *(long *)(in_FS_OFFSET + -0x440) + 1;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)name);
    if (iVar3 == 0) {
      pCVar6 = Cylinder::Create(renderFromObject,objectFromRender,reverseOrientation_local,
                                parameters,loc_00,alloc_local);
      scheme._M_dataplus._M_p = (pointer)pstd::pmr::new_delete_resource();
      scheme._M_string_length = 0;
      scheme.field_2._M_allocated_capacity = 0;
      scheme.field_2._8_8_ = 0;
      pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::reserve
                ((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *)
                 &scheme,1);
      *(ulong *)scheme._M_string_length = (ulong)pCVar6 | 0x2000000000000;
      scheme.field_2._8_8_ = scheme.field_2._M_allocated_capacity;
      pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
      operator=(__return_storage_ptr__,
                (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *)
                &scheme);
      scheme.field_2._8_8_ = 0;
      (**(code **)(*(long *)scheme._M_dataplus._M_p + 0x18))
                (scheme._M_dataplus._M_p,scheme._M_string_length,
                 scheme.field_2._M_allocated_capacity << 3,8);
      *(long *)(in_FS_OFFSET + -0x438) = *(long *)(in_FS_OFFSET + -0x438) + 1;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)name);
      if (iVar3 == 0) {
        pDVar7 = Disk::Create(renderFromObject,objectFromRender,reverseOrientation_local,parameters,
                              loc_00,alloc_local);
        scheme._M_dataplus._M_p = (pointer)pstd::pmr::new_delete_resource();
        scheme._M_string_length = 0;
        scheme.field_2._M_allocated_capacity = 0;
        scheme.field_2._8_8_ = 0;
        pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
        reserve((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *)
                &scheme,1);
        *(ulong *)scheme._M_string_length = (ulong)pDVar7 | 0x3000000000000;
        scheme.field_2._8_8_ = scheme.field_2._M_allocated_capacity;
        pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
        operator=(__return_storage_ptr__,
                  (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *
                  )&scheme);
        scheme.field_2._8_8_ = 0;
        (**(code **)(*(long *)scheme._M_dataplus._M_p + 0x18))
                  (scheme._M_dataplus._M_p,scheme._M_string_length,
                   scheme.field_2._M_allocated_capacity << 3,8);
        *(long *)(in_FS_OFFSET + -0x430) = *(long *)(in_FS_OFFSET + -0x430) + 1;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)name);
        if (iVar3 == 0) {
          mesh = BilinearPatch::CreateMesh
                           (renderFromObject,reverseOrientation_local,parameters,loc,alloc_local);
          BilinearPatch::CreatePatches
                    ((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                      *)&scheme,mesh,alloc_local);
          pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
          operator=(__return_storage_ptr__,
                    (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                     *)&scheme);
          scheme.field_2._8_8_ = 0;
          (**(code **)(*(long *)scheme._M_dataplus._M_p + 0x18))
                    (scheme._M_dataplus._M_p,scheme._M_string_length,
                     scheme.field_2._M_allocated_capacity << 3,8);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)name);
          if (iVar3 == 0) {
            Curve::Create((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                           *)&scheme,renderFromObject,objectFromRender,reverseOrientation_local,
                          parameters,loc,alloc_local);
            pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
            operator=(__return_storage_ptr__,
                      (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                       *)&scheme);
            scheme.field_2._8_8_ = 0;
            (**(code **)(*(long *)scheme._M_dataplus._M_p + 0x18))
                      (scheme._M_dataplus._M_p,scheme._M_string_length,
                       scheme.field_2._M_allocated_capacity << 3,8);
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)name);
            if (iVar3 == 0) {
              pTVar4 = Triangle::CreateMesh
                                 (renderFromObject,reverseOrientation_local,parameters,loc,
                                  alloc_local);
              Triangle::CreateTriangles
                        ((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                          *)&scheme,pTVar4,alloc_local);
              pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
              ::operator=(__return_storage_ptr__,
                          (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                           *)&scheme);
              pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
              ::~vector((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                         *)&scheme);
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)name);
              if (iVar3 == 0) {
                quadMesh.alloc.memoryResource = (memory_resource *)&quadMesh.nAlloc;
                std::__cxx11::string::_M_construct<char_const*>((string *)&quadMesh,"filename","");
                ppiVar2 = &vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
                vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)ppiVar2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&vertexIndices,"");
                ParameterDictionary::GetOneString
                          (&scheme,parameters,(string *)&quadMesh,(string *)&vertexIndices);
                ResolveFilename(&filename,&scheme);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)scheme._M_dataplus._M_p != &scheme.field_2) {
                  operator_delete(scheme._M_dataplus._M_p,scheme.field_2._M_allocated_capacity + 1);
                }
                if ((pointer *)
                    vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != ppiVar2) {
                  operator_delete(vertexIndices.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)vertexIndices.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
                }
                if (quadMesh.alloc.memoryResource != (memory_resource *)&quadMesh.nAlloc) {
                  operator_delete(quadMesh.alloc.memoryResource,quadMesh.nAlloc + 1);
                }
                TriQuadMesh::ReadPLY((TriQuadMesh *)&scheme,&filename);
                if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  quadMesh.alloc.memoryResource = (memory_resource *)0x0;
                  quadMesh.ptr = (ShapeHandle *)0x0;
                  quadMesh.nAlloc = 0;
                  iVar3 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                                    (alloc_local.memoryResource,0x40,8);
                  pstd::pmr::polymorphic_allocator<std::byte>::
                  construct<pbrt::TriangleMesh,pbrt::Transform_const&,bool&,std::vector<int,std::allocator<int>>&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,std::vector<pbrt::Vector3<float>,std::allocator<pbrt::Vector3<float>>>,std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>&,std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>&,std::vector<int,std::allocator<int>>&>
                            (&alloc_local,(TriangleMesh *)CONCAT44(extraout_var,iVar3),
                             renderFromObject,&reverseOrientation_local,&local_d0,
                             (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                             &scheme,(vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                                      *)&quadMesh,
                             (vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *
                             )((long)&scheme.field_2 + 8),&local_100,&local_e8);
                  if (quadMesh.alloc.memoryResource != (memory_resource *)0x0) {
                    operator_delete(quadMesh.alloc.memoryResource,
                                    quadMesh.nAlloc - (long)quadMesh.alloc.memoryResource);
                  }
                  Triangle::CreateTriangles
                            (&quadMesh,(TriangleMesh *)CONCAT44(extraout_var,iVar3),alloc_local);
                  pstd::
                  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
                  operator=(__return_storage_ptr__,&quadMesh);
                  pstd::
                  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
                  ~vector(&quadMesh);
                }
                if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  quadMesh.alloc.memoryResource = (memory_resource *)0x0;
                  iVar3 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                                    (alloc_local.memoryResource,0x40,8);
                  pstd::pmr::polymorphic_allocator<std::byte>::
                  construct<pbrt::BilinearPatchMesh,pbrt::Transform_const&,bool&,std::vector<int,std::allocator<int>>&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>&,std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>&,std::vector<int,std::allocator<int>>&,decltype(nullptr)>
                            (&alloc_local,(BilinearPatchMesh *)CONCAT44(extraout_var_00,iVar3),
                             renderFromObject,&reverseOrientation_local,&local_b8,
                             (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                             &scheme,(vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                                      *)((long)&scheme.field_2 + 8),&local_100,&local_e8,
                             (void **)&quadMesh);
                  BilinearPatch::CreatePatches
                            (&quadMesh,(BilinearPatchMesh *)CONCAT44(extraout_var_00,iVar3),
                             alloc_local);
                  pstd::
                  vector<pbrt::ShapeHandle,pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>>::
                  insert<pbrt::ShapeHandle*>
                            ((vector<pbrt::ShapeHandle,pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>>
                              *)__return_storage_ptr__,
                             __return_storage_ptr__->ptr + __return_storage_ptr__->nStored,
                             quadMesh.ptr,quadMesh.ptr + quadMesh.nStored);
                  pstd::
                  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
                  ~vector(&quadMesh);
                }
                TriQuadMesh::~TriQuadMesh((TriQuadMesh *)&scheme);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)filename._M_dataplus._M_p != &filename.field_2) {
                  uVar8 = filename.field_2._M_allocated_capacity + 1;
                  _Var9 = filename._M_dataplus;
LAB_0024146e:
                  operator_delete(_Var9._M_p,uVar8);
                }
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)name);
                if (iVar3 != 0) {
                  fmt = "%s: shape type unknown.";
                  goto LAB_00241496;
                }
                paVar1 = &scheme.field_2;
                scheme._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)&scheme,"levels","");
                iVar3 = ParameterDictionary::GetOneInt(parameters,&scheme,3);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)scheme._M_dataplus._M_p != paVar1) {
                  operator_delete(scheme._M_dataplus._M_p,scheme.field_2._M_allocated_capacity + 1);
                }
                scheme._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)&scheme,"indices","");
                ParameterDictionary::GetIntArray(&vertexIndices,parameters,&scheme);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)scheme._M_dataplus._M_p != paVar1) {
                  operator_delete(scheme._M_dataplus._M_p,scheme.field_2._M_allocated_capacity + 1);
                }
                if (vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start ==
                    vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  ErrorExit(loc,"Vertex indices \"indices\" not provided for LoopSubdiv shape.");
                }
                scheme._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)&scheme,"P","");
                ParameterDictionary::GetPoint3fArray(&P,parameters,&scheme);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)scheme._M_dataplus._M_p != paVar1) {
                  operator_delete(scheme._M_dataplus._M_p,scheme.field_2._M_allocated_capacity + 1);
                }
                if (P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  ErrorExit(loc,"Vertex positions \"P\" not provided for LoopSubdiv shape.");
                }
                filename._M_dataplus._M_p = (pointer)&filename.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&filename,"scheme","");
                quadMesh.alloc.memoryResource = (memory_resource *)&quadMesh.nAlloc;
                std::__cxx11::string::_M_construct<char_const*>((string *)&quadMesh,"loop","");
                ParameterDictionary::GetOneString(&scheme,parameters,&filename,(string *)&quadMesh);
                if (quadMesh.alloc.memoryResource != (memory_resource *)&quadMesh.nAlloc) {
                  operator_delete(quadMesh.alloc.memoryResource,quadMesh.nAlloc + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)filename._M_dataplus._M_p != &filename.field_2) {
                  operator_delete(filename._M_dataplus._M_p,
                                  filename.field_2._M_allocated_capacity + 1);
                }
                vertexIndices_00.n =
                     (long)vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2;
                p.n = ((long)P.
                             super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)P.
                             super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
                p.ptr = P.
                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
                vertexIndices_00.ptr =
                     vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
                pTVar4 = LoopSubdivide(renderFromObject,reverseOrientation_local,iVar3,
                                       vertexIndices_00,p,alloc_local);
                Triangle::CreateTriangles
                          ((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                            *)&filename,pTVar4,alloc_local);
                pstd::
                vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
                operator=(__return_storage_ptr__,
                          (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                           *)&filename);
                pstd::
                vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
                ~vector((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                         *)&filename);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)scheme._M_dataplus._M_p != &scheme.field_2) {
                  operator_delete(scheme._M_dataplus._M_p,scheme.field_2._M_allocated_capacity + 1);
                }
                if (P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(P.
                                  super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)P.
                                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)P.
                                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  uVar8 = (long)vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start;
                  _Var9._M_p = (pointer)vertexIndices.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start;
                  goto LAB_0024146e;
                }
              }
            }
          }
        }
      }
    }
  }
  if (__return_storage_ptr__->nStored != 0) {
    return __return_storage_ptr__;
  }
  fmt = "%s: unable to create shape.";
LAB_00241496:
  ErrorExit<std::__cxx11::string_const&>(loc,fmt,name);
}

Assistant:

pstd::vector<ShapeHandle> ShapeHandle::Create(const std::string &name,
                                              const Transform *renderFromObject,
                                              const Transform *objectFromRender,
                                              bool reverseOrientation,
                                              const ParameterDictionary &parameters,
                                              const FileLoc *loc, Allocator alloc) {
    pstd::vector<ShapeHandle> shapes(alloc);
    if (name == "sphere") {
        shapes = {Sphere::Create(renderFromObject, objectFromRender, reverseOrientation,
                                 parameters, loc, alloc)};
        ++nSpheres;
    }
    // Create remaining single _Shape_ types
    else if (name == "cylinder") {
        shapes = {Cylinder::Create(renderFromObject, objectFromRender, reverseOrientation,
                                   parameters, loc, alloc)};
        ++nCylinders;
    } else if (name == "disk") {
        shapes = {Disk::Create(renderFromObject, objectFromRender, reverseOrientation,
                               parameters, loc, alloc)};
        ++nDisks;
    } else if (name == "bilinearmesh") {
        BilinearPatchMesh *mesh = BilinearPatch::CreateMesh(
            renderFromObject, reverseOrientation, parameters, loc, alloc);
        shapes = BilinearPatch::CreatePatches(mesh, alloc);
    }
    // Create multiple-_Shape_ types
    else if (name == "curve")
        shapes = Curve::Create(renderFromObject, objectFromRender, reverseOrientation,
                               parameters, loc, alloc);
    else if (name == "trianglemesh") {
        TriangleMesh *mesh = Triangle::CreateMesh(renderFromObject, reverseOrientation,
                                                  parameters, loc, alloc);
        shapes = Triangle::CreateTriangles(mesh, alloc);
    } else if (name == "plymesh") {
        std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));
        TriQuadMesh plyMesh = TriQuadMesh::ReadPLY(filename);

        if (!plyMesh.triIndices.empty()) {
            TriangleMesh *mesh = alloc.new_object<TriangleMesh>(
                *renderFromObject, reverseOrientation, plyMesh.triIndices, plyMesh.p,
                std::vector<Vector3f>(), plyMesh.n, plyMesh.uv, plyMesh.faceIndices);
            shapes = Triangle::CreateTriangles(mesh, alloc);
        }

        if (!plyMesh.quadIndices.empty()) {
            BilinearPatchMesh *mesh = alloc.new_object<BilinearPatchMesh>(
                *renderFromObject, reverseOrientation, plyMesh.quadIndices, plyMesh.p,
                plyMesh.n, plyMesh.uv, plyMesh.faceIndices, nullptr /* image dist */);
            pstd::vector<ShapeHandle> quadMesh =
                BilinearPatch::CreatePatches(mesh, alloc);
            shapes.insert(shapes.end(), quadMesh.begin(), quadMesh.end());
        }
    } else if (name == "loopsubdiv") {
        int nLevels = parameters.GetOneInt("levels", 3);
        std::vector<int> vertexIndices = parameters.GetIntArray("indices");
        if (vertexIndices.empty())
            ErrorExit(loc, "Vertex indices \"indices\" not provided for "
                           "LoopSubdiv shape.");

        std::vector<Point3f> P = parameters.GetPoint3fArray("P");
        if (P.empty())
            ErrorExit(loc, "Vertex positions \"P\" not provided for LoopSubdiv shape.");

        // don't actually use this for now...
        std::string scheme = parameters.GetOneString("scheme", "loop");

        TriangleMesh *mesh = LoopSubdivide(renderFromObject, reverseOrientation, nLevels,
                                           vertexIndices, P, alloc);

        shapes = Triangle::CreateTriangles(mesh, alloc);
    } else
        ErrorExit(loc, "%s: shape type unknown.", name);

    if (shapes.empty())
        ErrorExit(loc, "%s: unable to create shape.", name);

    return shapes;
}